

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

string * __thiscall
spvtools::val::(anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Decoration *decoration,
          Instruction *built_in_inst,Instruction *referenced_inst,Instruction *referenced_from_inst,
          ExecutionModel execution_model)

{
  uint32_t uVar1;
  uint32_t uVar2;
  BuiltIn operand;
  ostream *poVar3;
  AssemblyGrammar *pAVar4;
  char *pcVar5;
  Instruction *inst;
  Instruction *inst_00;
  Instruction *inst_01;
  string local_210;
  string local_1f0;
  string local_1d0;
  ostringstream local_1b0 [8];
  ostringstream ss;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  GetIdDesc_abi_cxx11_(&local_1d0,(_anonymous_namespace_ *)referenced_from_inst,inst);
  poVar3 = std::operator<<((ostream *)local_1b0,(string *)&local_1d0);
  poVar3 = std::operator<<(poVar3," is referencing ");
  GetIdDesc_abi_cxx11_(&local_1f0,(_anonymous_namespace_ *)referenced_inst,inst_00);
  std::operator<<(poVar3,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  uVar1 = Instruction::id(built_in_inst);
  uVar2 = Instruction::id(referenced_inst);
  if (uVar1 != uVar2) {
    poVar3 = std::operator<<((ostream *)local_1b0," which is dependent on ");
    GetIdDesc_abi_cxx11_(&local_210,(_anonymous_namespace_ *)built_in_inst,inst_01);
    std::operator<<(poVar3,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
  }
  std::operator<<((ostream *)local_1b0," which is decorated with BuiltIn ");
  pAVar4 = ValidationState_t::grammar(*this);
  operand = Decoration::builtin(decoration);
  pcVar5 = AssemblyGrammar::lookupOperandName(pAVar4,SPV_OPERAND_TYPE_BUILT_IN,operand);
  std::operator<<((ostream *)local_1b0,pcVar5);
  if (*(int *)((long)this + 0x38) != 0) {
    poVar3 = std::operator<<((ostream *)local_1b0," in function <");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(uint *)((long)this + 0x38));
    std::operator<<(poVar3,">");
    if (execution_model != Max) {
      std::operator<<((ostream *)local_1b0," called with execution model ");
      pAVar4 = ValidationState_t::grammar(*this);
      pcVar5 = AssemblyGrammar::lookupOperandName
                         (pAVar4,SPV_OPERAND_TYPE_EXECUTION_MODEL,execution_model);
      std::operator<<((ostream *)local_1b0,pcVar5);
    }
  }
  std::operator<<((ostream *)local_1b0,".");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltInsValidator::GetReferenceDesc(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst, const Instruction& referenced_from_inst,
    spv::ExecutionModel execution_model) const {
  std::ostringstream ss;
  ss << GetIdDesc(referenced_from_inst) << " is referencing "
     << GetIdDesc(referenced_inst);
  if (built_in_inst.id() != referenced_inst.id()) {
    ss << " which is dependent on " << GetIdDesc(built_in_inst);
  }

  ss << " which is decorated with BuiltIn ";
  ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                      (uint32_t)decoration.builtin());
  if (function_id_) {
    ss << " in function <" << function_id_ << ">";
    if (execution_model != spv::ExecutionModel::Max) {
      ss << " called with execution model ";
      ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_EXECUTION_MODEL,
                                          uint32_t(execution_model));
    }
  }
  ss << ".";
  return ss.str();
}